

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O0

exr_result_t
exr_decoding_choose_default_routines
          (exr_const_context_t ctxt,int part_index,exr_decode_pipeline_t *decode)

{
  long lVar1;
  exr_result_t eVar2;
  internal_exr_unpack_fn p_Var3;
  long in_RDX;
  int in_ESI;
  char *in_RDI;
  bool bVar4;
  exr_coding_channel_info_t *decc;
  int c;
  exr_const_priv_part_t part;
  uint8_t *interleaveptr;
  int32_t sameoutinc;
  int32_t simplineoff;
  int32_t simpinterleaverev;
  int32_t simpinterleave;
  int32_t hastypechange;
  int32_t hassampling;
  int32_t sameoutbpc;
  int32_t samebpc;
  int32_t sameouttype;
  int32_t sametype;
  int32_t chanstounpack;
  int32_t chanstofill;
  int32_t isdeep;
  int in_stack_ffffffffffffff1c;
  int in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff58;
  undefined8 *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff68;
  int local_94;
  long lVar5;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  undefined4 local_68;
  int local_64;
  int local_60;
  uint local_5c;
  uint local_58;
  int local_54;
  int local_50;
  exr_result_t local_2c;
  
  local_50 = 0;
  local_54 = 0;
  local_58 = 0xfffffffe;
  local_5c = 0xfffffffe;
  local_60 = 0;
  local_64 = 0;
  local_68 = 0;
  local_6c = 0;
  local_70 = 0;
  local_74 = 0;
  local_78 = 0;
  local_7c = 0;
  lVar5 = 0;
  if (in_RDI == (char *)0x0) {
    local_2c = 2;
  }
  else if (*in_RDI == '\0') {
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      local_2c = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else {
      lVar1 = *(long *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
      if (in_RDX == 0) {
        local_2c = (**(code **)(in_RDI + 0x38))(in_RDI,3);
      }
      else if ((*(char **)(in_RDX + 0x18) == in_RDI) && (*(int *)(in_RDX + 0x14) == in_ESI)) {
        bVar4 = true;
        if (*(int *)(lVar1 + 4) != 2) {
          bVar4 = *(int *)(lVar1 + 4) == 3;
        }
        for (local_94 = 0; local_94 < *(short *)(in_RDX + 0x10); local_94 = local_94 + 1) {
          in_stack_ffffffffffffff60 = (undefined8 *)(*(long *)(in_RDX + 8) + (long)local_94 * 0x30);
          if (((*(int *)(in_stack_ffffffffffffff60 + 1) != 0) && (in_stack_ffffffffffffff60[5] != 0)
              ) && (!bVar4)) {
            if ((*(short *)((long)in_stack_ffffffffffffff60 + 0x1c) != 2) &&
               (*(short *)((long)in_stack_ffffffffffffff60 + 0x1c) != 4)) {
              eVar2 = (**(code **)(in_RDI + 0x48))
                                (in_RDI,3,
                                 "Invalid / unsupported output bytes per element (%d) for channel %c (%s)"
                                 ,(int)*(short *)((long)in_stack_ffffffffffffff60 + 0x1c),local_94,
                                 *in_stack_ffffffffffffff60);
              return eVar2;
            }
            if (((*(short *)((long)in_stack_ffffffffffffff60 + 0x1e) != 1) &&
                (*(short *)((long)in_stack_ffffffffffffff60 + 0x1e) != 2)) &&
               (*(short *)((long)in_stack_ffffffffffffff60 + 0x1e) != 0)) {
              eVar2 = (**(code **)(in_RDI + 0x48))
                                (in_RDI,3,
                                 "Invalid / unsupported output data type (%d) for channel %c (%s)",
                                 *(undefined2 *)((long)in_stack_ffffffffffffff60 + 0x1e),local_94,
                                 *in_stack_ffffffffffffff60);
              return eVar2;
            }
            if (local_58 == 0xfffffffe) {
              local_58 = (uint)*(ushort *)((long)in_stack_ffffffffffffff60 + 0x1a);
            }
            else if (local_58 != *(ushort *)((long)in_stack_ffffffffffffff60 + 0x1a)) {
              local_58 = 0xffffffff;
            }
            if (local_5c == 0xfffffffe) {
              local_5c = (uint)*(ushort *)((long)in_stack_ffffffffffffff60 + 0x1e);
            }
            else if (local_5c != *(ushort *)((long)in_stack_ffffffffffffff60 + 0x1e)) {
              local_5c = 0xffffffff;
            }
            if (local_60 == 0) {
              local_60 = (int)*(char *)((long)in_stack_ffffffffffffff60 + 0x19);
            }
            else if (local_60 != *(char *)((long)in_stack_ffffffffffffff60 + 0x19)) {
              local_60 = -1;
            }
            if (local_64 == 0) {
              local_64 = (int)*(short *)((long)in_stack_ffffffffffffff60 + 0x1c);
            }
            else if (local_64 != *(short *)((long)in_stack_ffffffffffffff60 + 0x1c)) {
              local_64 = -1;
            }
            if ((*(int *)(in_stack_ffffffffffffff60 + 2) != 1) ||
               (*(int *)((long)in_stack_ffffffffffffff60 + 0x14) != 1)) {
              local_68 = 1;
            }
            local_50 = local_50 + 1;
            if (*(int *)(in_stack_ffffffffffffff60 + 4) !=
                (int)*(char *)((long)in_stack_ffffffffffffff60 + 0x19)) {
              local_54 = local_54 + 1;
            }
            if (*(short *)((long)in_stack_ffffffffffffff60 + 0x1e) !=
                *(short *)((long)in_stack_ffffffffffffff60 + 0x1a)) {
              local_6c = local_6c + 1;
            }
            if (local_78 == 0) {
              local_78 = *(int *)((long)in_stack_ffffffffffffff60 + 0x24);
            }
            else if (local_78 != *(int *)((long)in_stack_ffffffffffffff60 + 0x24)) {
              local_78 = -1;
            }
            if (local_70 == 0) {
              lVar5 = in_stack_ffffffffffffff60[5];
              local_70 = *(int *)(in_stack_ffffffffffffff60 + 4);
              local_74 = *(int *)(in_stack_ffffffffffffff60 + 4);
            }
            else {
              if ((0 < local_70) &&
                 (in_stack_ffffffffffffff60[5] !=
                  lVar5 + local_94 * *(short *)((long)in_stack_ffffffffffffff60 + 0x1c))) {
                local_70 = -1;
              }
              if ((0 < local_74) &&
                 (in_stack_ffffffffffffff60[5] !=
                  lVar5 - local_94 * *(short *)((long)in_stack_ffffffffffffff60 + 0x1c))) {
                local_74 = -1;
              }
              if ((local_70 < 0) && (local_74 < 0)) {
                lVar5 = 0;
              }
            }
            if (local_7c == 0) {
              local_7c = *(int *)(in_stack_ffffffffffffff60 + 4);
            }
            else if (local_7c != *(int *)(in_stack_ffffffffffffff60 + 4)) {
              local_7c = -1;
            }
          }
        }
        if (local_70 != local_64 * *(short *)(in_RDX + 0x10)) {
          local_70 = -1;
        }
        if (local_74 != local_64 * *(short *)(in_RDX + 0x10)) {
          local_74 = -1;
        }
        if (((((bVar4) || (*(int *)(lVar1 + 0xb0) != 0)) || (local_54 != 0)) ||
            ((local_6c != 0 || (local_50 < 1)))) || (local_50 != *(short *)(in_RDX + 0x10))) {
          *(code **)(in_RDX + 0xe8) = default_read_chunk;
          if (*(int *)(lVar1 + 0xb0) != 0) {
            *(code **)(in_RDX + 0xf0) = exr_uncompress_chunk;
          }
          p_Var3 = internal_exr_match_decode
                             ((exr_decode_pipeline_t *)CONCAT44(in_stack_ffffffffffffff2c,local_68),
                              in_stack_ffffffffffffff24,local_64,in_stack_ffffffffffffff1c,local_60,
                              0,local_70,local_74,local_78,in_stack_ffffffffffffff58,
                              (int)in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,(int)lVar1,
                              (int)lVar5);
          *(internal_exr_unpack_fn *)(in_RDX + 0x100) = p_Var3;
          if (*(long *)(in_RDX + 0x100) == 0) {
            local_2c = (**(code **)(in_RDI + 0x40))
                                 (in_RDI,4,"Unable to choose valid unpack routine");
          }
          else {
            local_2c = 0;
          }
        }
        else {
          *(code **)(in_RDX + 0xe8) = read_uncompressed_direct;
          *(undefined8 *)(in_RDX + 0xf0) = 0;
          *(undefined8 *)(in_RDX + 0x100) = 0;
          local_2c = 0;
        }
      }
      else {
        local_2c = (**(code **)(in_RDI + 0x48))
                             (in_RDI,3,
                              "Cross-wired request for default routines from different context / part"
                             );
      }
    }
  }
  else {
    local_2c = (**(code **)(in_RDI + 0x38))(in_RDI,7);
  }
  return local_2c;
}

Assistant:

exr_result_t
exr_decoding_choose_default_routines (
    exr_const_context_t ctxt, int part_index, exr_decode_pipeline_t* decode)
{
    int32_t isdeep = 0, chanstofill = 0, chanstounpack = 0, sametype = -2,
            sameouttype = -2, samebpc = 0, sameoutbpc = 0, hassampling = 0,
            hastypechange = 0, simpinterleave = 0, simpinterleaverev = 0,
            simplineoff = 0, sameoutinc = 0;
    uint8_t* interleaveptr = NULL;
    EXR_READONLY_AND_DEFINE_PART (part_index);
    if (!decode) return ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT);

    if (decode->context != ctxt || decode->part_index != part_index)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Cross-wired request for default routines from different context / part");

    isdeep = (part->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
              part->storage_mode == EXR_STORAGE_DEEP_TILED)
                 ? 1
                 : 0;

    for (int c = 0; c < decode->channel_count; ++c)
    {
        exr_coding_channel_info_t* decc = (decode->channels + c);

        if (decc->height == 0 || !decc->decode_to_ptr) continue;

        if (isdeep) continue;

        /*
         * if a user specifies a bad pixel stride / line stride
         * we can't know this realistically, and they may want to
         * use 0 to cause things to collapse for testing purposes
         * so only test the values we know we use for decisions
         */
        if (decc->user_bytes_per_element != 2 &&
            decc->user_bytes_per_element != 4)
            return ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid / unsupported output bytes per element (%d) for channel %c (%s)",
                (int) decc->user_bytes_per_element,
                c,
                decc->channel_name);

        if (decc->user_data_type != (uint16_t) (EXR_PIXEL_HALF) &&
            decc->user_data_type != (uint16_t) (EXR_PIXEL_FLOAT) &&
            decc->user_data_type != (uint16_t) (EXR_PIXEL_UINT))
            return ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid / unsupported output data type (%d) for channel %c (%s)",
                (int) decc->user_data_type,
                c,
                decc->channel_name);

        if (sametype == -2)
            sametype = (int32_t) decc->data_type;
        else if (sametype != (int32_t) decc->data_type)
            sametype = -1;

        if (sameouttype == -2)
            sameouttype = (int32_t) decc->user_data_type;
        else if (sameouttype != (int32_t) decc->user_data_type)
            sameouttype = -1;

        if (samebpc == 0)
            samebpc = decc->bytes_per_element;
        else if (samebpc != decc->bytes_per_element)
            samebpc = -1;

        if (sameoutbpc == 0)
            sameoutbpc = decc->user_bytes_per_element;
        else if (sameoutbpc != decc->user_bytes_per_element)
            sameoutbpc = -1;

        if (decc->x_samples != 1 || decc->y_samples != 1) hassampling = 1;

        ++chanstofill;
        if (decc->user_pixel_stride != decc->bytes_per_element) ++chanstounpack;
        if (decc->user_data_type != decc->data_type) ++hastypechange;

        if (simplineoff == 0)
            simplineoff = decc->user_line_stride;
        else if (simplineoff != decc->user_line_stride)
            simplineoff = -1;

        if (simpinterleave == 0)
        {
            interleaveptr     = decc->decode_to_ptr;
            simpinterleave    = decc->user_pixel_stride;
            simpinterleaverev = decc->user_pixel_stride;
        }
        else
        {
            if (simpinterleave > 0 &&
                decc->decode_to_ptr !=
                    (interleaveptr + c * decc->user_bytes_per_element))
            {
                simpinterleave = -1;
            }
            if (simpinterleaverev > 0 &&
                decc->decode_to_ptr !=
                    (interleaveptr - c * decc->user_bytes_per_element))
            {
                simpinterleaverev = -1;
            }
            if (simpinterleave < 0 && simpinterleaverev < 0)
                interleaveptr = NULL;
        }

        if (sameoutinc == 0)
            sameoutinc = decc->user_pixel_stride;
        else if (sameoutinc != decc->user_pixel_stride)
            sameoutinc = -1;
    }

    if (simpinterleave != sameoutbpc * decode->channel_count)
        simpinterleave = -1;
    if (simpinterleaverev != sameoutbpc * decode->channel_count)
        simpinterleaverev = -1;

    /* special case, uncompressed and reading planar data straight in
     * to all the channels */
    if (!isdeep && part->comp_type == EXR_COMPRESSION_NONE &&
        chanstounpack == 0 && hastypechange == 0 && chanstofill > 0 &&
        chanstofill == decode->channel_count)
    {
        decode->read_fn               = &read_uncompressed_direct;
        decode->decompress_fn         = NULL;
        decode->unpack_and_convert_fn = NULL;
        return EXR_ERR_SUCCESS;
    }
    decode->read_fn = &default_read_chunk;
    if (part->comp_type != EXR_COMPRESSION_NONE)
        decode->decompress_fn = &exr_uncompress_chunk;

    decode->unpack_and_convert_fn = internal_exr_match_decode (
        decode,
        isdeep,
        chanstofill,
        chanstounpack,
        sametype,
        sameouttype,
        samebpc,
        sameoutbpc,
        hassampling,
        hastypechange,
        sameoutinc,
        simpinterleave,
        simpinterleaverev,
        simplineoff);

    if (!decode->unpack_and_convert_fn)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_ARGUMENT_OUT_OF_RANGE,
            "Unable to choose valid unpack routine");

    return EXR_ERR_SUCCESS;
}